

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O3

void Saig_DetectConstrCollectSuper_rec(Aig_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  long lVar4;
  
  if (((ulong)pObj & 1) == 0) {
    uVar1 = *(uint *)&pObj->field_0x18;
    while (0xfffffffd < (uVar1 & 7) - 7) {
      Saig_DetectConstrCollectSuper_rec(pObj->pFanin0,vSuper);
      pObj = pObj->pFanin1;
      if (((ulong)pObj & 1) != 0) break;
      uVar1 = *(uint *)&pObj->field_0x18;
    }
  }
  iVar2 = vSuper->nSize;
  if (0 < (long)iVar2) {
    lVar4 = 0;
    do {
      if (vSuper->pArray[lVar4] == (void *)((ulong)pObj ^ 1)) {
        return;
      }
      lVar4 = lVar4 + 1;
    } while (iVar2 != lVar4);
  }
  if (iVar2 == vSuper->nCap) {
    if (iVar2 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar3;
      vSuper->nCap = 0x10;
    }
    else {
      __size = (ulong)(uint)(iVar2 * 2) * 8;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(__size);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,__size);
      }
      vSuper->pArray = ppvVar3;
      vSuper->nCap = iVar2 * 2;
    }
  }
  else {
    ppvVar3 = vSuper->pArray;
  }
  iVar2 = vSuper->nSize;
  vSuper->nSize = iVar2 + 1;
  ppvVar3[iVar2] = (void *)((ulong)pObj ^ 1);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

/*
    Property holds iff it is const 0.
    Constraint holds iff it is const 0.

    The following structure is used for folding constraints:
    - the output of OR gate is 0 as long as all constraints hold
    - as soon as one constraint fail, the property output becomes 0 forever
      because the flop becomes 1 and it stays 1 forever


       property output

             |
          |-----|
          | and |
          |-----|
           |   |
           |  / \
           | /inv\
           | -----
       ____|   |_________________________
       |             |                  |
      / \       -----------             |   
     /   \      |   or    |             |
    /     \     -----------             |
   / logic \     |   |   |              |
  /  cone   \    |   |   |              |
 /___________\   |   |   |              |
                 |   | ------           |   
                 |   | |flop| (init=0)  |
                 |   | ------           |
                 |   |   |              |
                 |   |   |______________| 
                 |   |
                 c1  c2 
*/

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collects the supergate.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Saig_DetectConstrCollectSuper_rec( Aig_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Aig_IsComplement(pObj) || !Aig_ObjIsNode(pObj) )//|| (Aig_ObjRefs(pObj) > 1) )
    {
        Vec_PtrPushUnique( vSuper, Aig_Not(pObj) );
        return;
    }
    // go through the branches
    Saig_DetectConstrCollectSuper_rec( Aig_ObjChild0(pObj), vSuper );
    Saig_DetectConstrCollectSuper_rec( Aig_ObjChild1(pObj), vSuper );
}